

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alex_base.h
# Opt level: O0

void __thiscall alex::LinearModelBuilder<int>::add(LinearModelBuilder<int> *this,int x,int y)

{
  int *piVar1;
  double *pdVar2;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  double local_20;
  double local_18;
  int local_10;
  int local_c [3];
  
  *(int *)(in_RDI + 8) = *(int *)(in_RDI + 8) + 1;
  *(longdouble *)(in_RDI + 0x10) = *(longdouble *)(in_RDI + 0x10) + (longdouble)in_ESI;
  *(longdouble *)(in_RDI + 0x20) = *(longdouble *)(in_RDI + 0x20) + (longdouble)in_EDX;
  *(longdouble *)(in_RDI + 0x30) =
       (longdouble)in_ESI * (longdouble)in_ESI + *(longdouble *)(in_RDI + 0x30);
  *(longdouble *)(in_RDI + 0x40) =
       (longdouble)in_ESI * (longdouble)in_EDX + *(longdouble *)(in_RDI + 0x40);
  local_10 = in_EDX;
  piVar1 = std::min<int>(local_c,(int *)(in_RDI + 0x50));
  *(int *)(in_RDI + 0x50) = *piVar1;
  piVar1 = std::max<int>(local_c,(int *)(in_RDI + 0x54));
  *(int *)(in_RDI + 0x54) = *piVar1;
  local_18 = (double)local_10;
  pdVar2 = std::min<double>(&local_18,(double *)(in_RDI + 0x58));
  *(double *)(in_RDI + 0x58) = *pdVar2;
  local_20 = (double)local_10;
  pdVar2 = std::max<double>(&local_20,(double *)(in_RDI + 0x60));
  *(double *)(in_RDI + 0x60) = *pdVar2;
  return;
}

Assistant:

inline void add(T x, int y) {
    count_++;
    x_sum_ += static_cast<long double>(x);
    y_sum_ += static_cast<long double>(y);
    xx_sum_ += static_cast<long double>(x) * x;
    xy_sum_ += static_cast<long double>(x) * y;
    x_min_ = std::min<T>(x, x_min_);
    x_max_ = std::max<T>(x, x_max_);
    y_min_ = std::min<double>(y, y_min_);
    y_max_ = std::max<double>(y, y_max_);
  }